

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O1

void __thiscall
PA5Application::RenderObject::setProgramMaterial
          (RenderObject *this,shared_ptr<Program> *program,SimpleMaterial *material)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Program *pPVar2;
  Sampler *pSVar3;
  string local_58;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_38;
  
  (**(((program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
     super_OGLStateObject)._vptr_OGLStateObject)();
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[0].direction","");
  local_38._0_8_ = 0xbf3504f300000000;
  local_38.field_0.z = 0.70710677;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[0].intensity","");
  local_38._0_8_ = 0x3f3333333f333333;
  local_38.field_0.z = 0.7;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[1].direction","");
  local_38._0_8_ = 0x3f64f92e00000000;
  local_38.field_0.z = 0.4472136;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[1].intensity","");
  local_38._0_8_ = 0x3f0000003f000000;
  local_38.field_0.z = 0.5;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[2].direction","");
  local_38._0_8_ = 0xbf3504f3;
  local_38.field_0.z = 0.70710677;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"lightsInWorld[2].intensity","");
  local_38._0_8_ = 0x3f19999a3f19999a;
  local_38.field_0.z = 0.6;
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>
            (pPVar2,&local_58,(vec<3,_float,_(glm::qualifier)0> *)&local_38.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.ambient","");
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar2,&local_58,&material->ambient);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.diffuse","");
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar2,&local_58,&material->diffuse);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.specular","");
  Program::setUniform<glm::vec<3,float,(glm::qualifier)0>>(pPVar2,&local_58,&material->specular);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.shininess","");
  Program::setUniform<float>(pPVar2,&local_58,&material->shininess);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = (this->m_diffusemap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.colormap","");
  Sampler::attachToProgram(pSVar3,pPVar2,&local_58,DoNotBind);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = (this->m_normalmap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.normalmap","");
  Sampler::attachToProgram(pSVar3,pPVar2,&local_58,DoNotBind);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = (this->m_specularmap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
           _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
           super__Head_base<0UL,_Sampler_*,_false>._M_head_impl;
  pPVar2 = (program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"material.specularmap","");
  Sampler::attachToProgram(pSVar3,pPVar2,&local_58,DoNotBind);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (*(((program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_OGLStateObject)._vptr_OGLStateObject[1])();
  return;
}

Assistant:

void PA5Application::RenderObject::setProgramMaterial(std::shared_ptr<Program> & program, const SimpleMaterial & material) const
{
  program->bind();
  program->setUniform("lightsInWorld[0].direction", glm::normalize(glm::vec3(0, -1, 1)));
  program->setUniform("lightsInWorld[0].intensity", glm::vec3(0.7, 0.7, 0.7));
  program->setUniform("lightsInWorld[1].direction", glm::normalize(glm::vec3(0, 1, 0.5)));
  program->setUniform("lightsInWorld[1].intensity", glm::vec3(0.5, 0.5, 0.5));
  program->setUniform("lightsInWorld[2].direction", glm::normalize(glm::vec3(-1, 0, 1)));
  program->setUniform("lightsInWorld[2].intensity", glm::vec3(0.6, 0.6, 0.6));
  program->setUniform("material.ambient", material.ambient);
  program->setUniform("material.diffuse", material.diffuse);
  program->setUniform("material.specular", material.specular);
  program->setUniform("material.shininess", material.shininess);
  m_diffusemap->attachToProgram(*program, "material.colormap", Sampler::DoNotBind);
  m_normalmap->attachToProgram(*program, "material.normalmap", Sampler::DoNotBind);
  m_specularmap->attachToProgram(*program, "material.specularmap", Sampler::DoNotBind);
  program->unbind();
}